

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

char * __thiscall CVmDateLocale::get(CVmDateLocale *this,size_t *len,int idx)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  int in_EDX;
  size_t *in_RSI;
  CVmObjVector *in_RDI;
  char *str;
  vm_val_t ele;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar4;
  char *local_8;
  
  if (in_EDX < 0) {
    *in_RSI = 0;
    local_8 = (char *)0x0;
  }
  else {
    if (((in_RDI->super_CVmObjCollection).super_CVmObject.ext_ != (char *)0x0) &&
       (iVar4 = in_EDX, sVar1 = CVmObjVector::get_element_count((CVmObjVector *)0x34815f),
       iVar4 < (int)sVar1)) {
      CVmObjVector::get_element
                (in_RDI,CONCAT44(iVar4,in_stack_ffffffffffffffb8),(vm_val_t *)0x348182);
      pcVar2 = vm_val_t::get_as_string((vm_val_t *)CONCAT44(iVar4,in_stack_ffffffffffffffb8));
      if (pcVar2 != (char *)0x0) {
        sVar1 = vmb_get_len((char *)0x3481a3);
        *in_RSI = sVar1;
        return pcVar2 + 2;
      }
    }
    if (in_EDX < 0xf) {
      sVar3 = strlen(defaults[in_EDX]);
      *in_RSI = sVar3;
      local_8 = defaults[in_EDX];
    }
    else {
      *in_RSI = 0;
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

const char *get(VMG_ size_t &len, int idx)
    {
        /* if it's negative, it's invalid */
        if (idx < 0)
        {
            len = 0;
            return 0;
        }

        /* try getting it from the state vector */
        if (vec != 0 && idx < (int)vec->get_element_count())
        {
            /* get the element */
            vm_val_t ele;
            vec->get_element(idx, &ele);

            /* if it's a string, return it */
            const char *str = ele.get_as_string(vmg0_);
            if (str != 0)
            {
                len = vmb_get_len(str);
                return str + VMB_LEN;
            }
        }

        /* we didn't find it in the state vector; return the default */
        if (idx < ndefaults)
        {
            len = strlen(defaults[idx]);
            return defaults[idx];
        }
        
        /* invalid entry */
        len = 0;
        return 0;
    }